

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O3

void __thiscall jrtplib::RTPTCPTransmitter::Destroy(RTPTCPTransmitter *this)

{
  if ((this->m_init == true) && (this->m_created == true)) {
    ClearDestSockets(this);
    FlushPackets(this);
    this->m_created = false;
    if (this->m_waitingForData == true) {
      RTPAbortDescriptors::SendAbortSignal(this->m_pAbortDesc);
    }
    RTPAbortDescriptors::Destroy(&this->m_abortDesc);
    return;
  }
  return;
}

Assistant:

void RTPTCPTransmitter::Destroy()
{
	if (!m_init)
		return;

	MAINMUTEX_LOCK
	if (!m_created)
	{
		MAINMUTEX_UNLOCK;
		return;
	}

	ClearDestSockets();
	FlushPackets();
	m_created = false;
	
	if (m_waitingForData)
	{
		m_pAbortDesc->SendAbortSignal();
		m_abortDesc.Destroy(); // Doesn't do anything if not initialized
		MAINMUTEX_UNLOCK
		WAITMUTEX_LOCK // to make sure that the WaitForIncomingData function ended
		WAITMUTEX_UNLOCK
	}
	else
		m_abortDesc.Destroy(); // Doesn't do anything if not initialized

	MAINMUTEX_UNLOCK
}